

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,__1,__1> __thiscall
Matrix<double,_-1,_-1>::operator+(Matrix<double,__1,__1> *this,Matrix<double,__1,__1> *matrix)

{
  double dVar1;
  Matrix<double,__1,__1> MVar2;
  double *pdVar3;
  ostream *poVar4;
  int i;
  int iVar5;
  char *pcVar6;
  int j;
  int iVar7;
  Matrix<double,__1,__1> result;
  
  iVar5 = matrix->rows;
  if ((iVar5 == 0) || (iVar7 = matrix->cols, iVar7 == 0)) {
    pcVar6 = "can not plus two empty matrix!";
  }
  else {
    if ((iVar5 == this->rows) && (iVar7 == this->cols)) {
      result.data = (double *)0x0;
      result.rows = -1;
      result.cols = -1;
      resize(&result,iVar5,iVar7);
      for (iVar5 = 0; iVar5 < this->rows; iVar5 = iVar5 + 1) {
        for (iVar7 = 0; iVar7 < this->cols; iVar7 = iVar7 + 1) {
          pdVar3 = operator()(this,iVar5,iVar7);
          dVar1 = *pdVar3;
          pdVar3 = operator()(matrix,iVar5,iVar7);
          SetElement(&result,iVar5,iVar7,dVar1 + *pdVar3);
        }
      }
      MVar2.data = result.data;
      MVar2.rows = result.rows;
      MVar2.cols = result.cols;
      return MVar2;
    }
    pcVar6 = "can not plus matrix with different rows/cols";
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(-1);
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::operator+(const Matrix<Type, _0, _1> &matrix)
{
    if(matrix.row() == 0 || matrix.col() == 0)
    {
        cerr << "can not plus two empty matrix!" << endl;
        exit(-1);
    }
    if(matrix.row() != this->row() || 
       matrix.col() != this->col())
    {
        cerr << "can not plus matrix with different rows/cols" << endl;
        exit(-1);
    }

    Matrix<Type, _0, _1> result;
    if(_0 == Dynamic || _1 == Dynamic) 
        result.resize(matrix.row(), matrix.col());    

    for(int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
        {
            Type sum = this->operator()(i, j) + matrix(i, j);
            result.SetElement(i, j, sum);
        }
    return result;
}